

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawLines(ostream *out,MidiFile *midifile,vector<double,_std::allocator<double>_> *hues,
              Options *options)

{
  bool bVar1;
  bool bVar2;
  uint aTrack;
  int iVar3;
  int iVar4;
  MidiEventList *pMVar5;
  ostream *poVar6;
  MidiEvent *this;
  int j;
  Options *in_R8;
  string color;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_90,"dash",(allocator *)&local_50);
  bVar1 = smf::Options::getBoolean(options,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  aTrack = smf::MidiFile::size(midifile);
  while (0 < (int)aTrack) {
    aTrack = aTrack - 1;
    pMVar5 = smf::MidiFile::operator[](midifile,aTrack);
    iVar3 = hasNotes(pMVar5);
    if (iVar3 != 0) {
      std::__cxx11::to_string
                (&local_70,
                 (hues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[aTrack]);
      std::operator+(&local_50,"hsl(",&local_70);
      std::operator+(&local_90,&local_50,", 100%, 75%)");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (bwQ != 0) {
        std::__cxx11::string::_M_assign((string *)&local_90);
      }
      poVar6 = std::operator<<(out,"\t\t<g");
      poVar6 = std::operator<<(poVar6," class=\"note-lines track-");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,aTrack);
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6," fill=\"none\" stroke=\"");
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      std::operator<<(poVar6,"\"");
      if (bVar1) {
        std::operator<<(out," stroke-dasharray=\"");
        poVar6 = std::ostream::_M_insert<double>(2.25);
        std::operator<<(poVar6,"\"");
        std::operator<<(out," vector-effect=\"non-scaling-stroke\"");
      }
      std::operator<<(out," stroke-width=\"");
      poVar6 = std::ostream::_M_insert<double>(LineThickness);
      std::operator<<(poVar6,"\">\n");
      iVar3 = 0;
      while( true ) {
        pMVar5 = smf::MidiFile::operator[](midifile,aTrack);
        iVar4 = smf::MidiEventList::size(pMVar5);
        if (iVar4 <= iVar3) break;
        pMVar5 = smf::MidiFile::operator[](midifile,aTrack);
        this = smf::MidiEventList::operator[](pMVar5,iVar3);
        bVar2 = smf::MidiMessage::isNoteOn(&this->super_MidiMessage);
        if (bVar2) {
          printLineToNextNote(out,midifile,aTrack,iVar3,in_R8);
        }
        iVar3 = iVar3 + 1;
      }
      std::operator<<(out,"\t\t</g>\n");
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return;
}

Assistant:

void drawLines(ostream& out, MidiFile& midifile, vector<double>& hues,
      Options& options) {
   int dashing = options.getBoolean("dash");
   int track = 0;
   for (int i=midifile.size()-1; i>=0; i--) {
      if (!hasNotes(midifile[i])) {
         continue;
      }
      track = i;
      string color = "hsl(" + to_string(hues[i]) + ", 100%, 75%)";
      if (bwQ) {
         color = StaffColor;
      }
      out << "\t\t<g"
          << " class=\"note-lines track-" << track << "\""
          << " fill=\"none\" stroke=\"" << color << "\"";

      // double scale = options.getDouble("scale");
      if (dashing) {
         double dwidth = 2.25;
         out << " stroke-dasharray=\"" << dwidth << "\"";
         out << " vector-effect=\"non-scaling-stroke\"";
      }
      out << " stroke-width=\""<< LineThickness << "\">\n";
      for (int j=0; j<midifile[i].size(); j++) {
         if (!midifile[i][j].isNoteOn()) {
            continue;
         }
         printLineToNextNote(out, midifile, i, j, options);
      }
      out << "\t\t</g>\n";
   }
}